

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O0

void __thiscall crnlib::dxt_image::init_task(dxt_image *this,uint64 data,void *pData_ptr)

{
  int iVar1;
  image<crnlib::color_quad<unsigned_char,_int>_> *this_00;
  long lVar2;
  crn_thread_id_t cVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  crn_thread_id_t cVar9;
  color_quad<unsigned_char,_int> *pcVar10;
  long in_RDX;
  uint in_ESI;
  dxt_image *in_RDI;
  uint ix;
  uint x;
  uint iy;
  uint y;
  uint pixel_ofs_x;
  color_quad_u8 pixels [16];
  uint progress_percentage;
  uint block_x;
  uint pixel_ofs_y;
  uint block_y;
  int prev_progress_percentage;
  set_block_pixels_context optimizer_context;
  uint block_index;
  bool is_main_thread;
  pack_params *p;
  image_u8 *img;
  init_task_params *pInit_params;
  uint thread_index;
  uint in_stack_ffffffffffffeff0;
  uint in_stack_ffffffffffffeff4;
  set_block_pixels_context *in_stack_fffffffffffff010;
  color_quad<unsigned_char,_int> *local_fe8;
  uint local_fb8;
  uint local_fb0;
  color_quad<unsigned_char,_int> local_fa8 [16];
  color_quad<unsigned_char,_int> acStack_f68 [4];
  int local_f58;
  undefined4 local_f54;
  uint local_f50;
  int local_f4c;
  uint local_f48;
  int local_f44;
  set_block_pixels_context *in_stack_fffffffffffff220;
  pack_params *in_stack_fffffffffffff228;
  color_quad_u8 *in_stack_fffffffffffff230;
  uint in_stack_fffffffffffff238;
  uint in_stack_fffffffffffff23c;
  dxt_image *in_stack_fffffffffffff240;
  uint local_40;
  
  this_00 = *(image<crnlib::color_quad<unsigned_char,_int>_> **)(in_RDX + 8);
  lVar2 = *(long *)(in_RDX + 0x10);
  cVar9 = crn_get_current_thread_id();
  cVar3 = *(crn_thread_id_t *)(in_RDX + 0x18);
  local_40 = 0;
  set_block_pixels_context::set_block_pixels_context(in_stack_fffffffffffff010);
  local_f44 = -1;
  local_f48 = 0;
  do {
    if (in_RDI->m_blocks_y <= local_f48) {
      local_f54 = 0;
LAB_00217381:
      set_block_pixels_context::~set_block_pixels_context
                ((set_block_pixels_context *)
                 CONCAT44(in_stack_ffffffffffffeff4,in_stack_ffffffffffffeff0));
      return;
    }
    local_f4c = local_f48 << 2;
    for (local_f50 = 0; local_f50 < in_RDI->m_blocks_x; local_f50 = local_f50 + 1) {
      if (*(long *)(in_RDX + 0x20) != 0) {
        local_f54 = 1;
        goto LAB_00217381;
      }
      if (((*(long *)(lVar2 + 0x18) != 0) && (cVar9 == cVar3)) && ((local_40 & 0x3f) == 0x3f)) {
        iVar7 = *(int *)(lVar2 + 0x28);
        iVar1 = *(int *)(lVar2 + 0x2c);
        uVar5 = get_total_blocks(in_RDI);
        uVar6 = get_total_blocks(in_RDI);
        local_f58 = iVar7 + (local_40 * iVar1 + (uVar5 >> 1)) / uVar6;
        if ((local_f58 != local_f44) &&
           (local_f44 = local_f58,
           bVar4 = (**(code **)(lVar2 + 0x18))(local_f58,*(undefined8 *)(lVar2 + 0x20)),
           (bVar4 & 1) == 0)) {
          atomic_exchange32((atomic32_t *)(in_RDX + 0x20),1);
          local_f54 = 1;
          goto LAB_00217381;
        }
      }
      if ((*(int *)(lVar2 + 4) == 0) || (local_40 % (*(int *)(lVar2 + 4) + 1U) == in_ESI)) {
        local_fe8 = local_fa8;
        pcVar10 = acStack_f68;
        do {
          color_quad<unsigned_char,_int>::color_quad(local_fe8);
          local_fe8 = local_fe8 + 1;
        } while (local_fe8 != pcVar10);
        iVar7 = local_f50 * 4;
        for (local_fb0 = 0; local_fb0 < 4; local_fb0 = local_fb0 + 1) {
          uVar8 = local_f4c + local_fb0;
          uVar5 = image<crnlib::color_quad<unsigned_char,_int>_>::get_height(this_00);
          uVar8 = math::minimum<unsigned_int>(uVar8,uVar5 - 1);
          for (local_fb8 = 0; local_fb8 < 4; local_fb8 = local_fb8 + 1) {
            in_stack_ffffffffffffeff4 = iVar7 + local_fb8;
            uVar5 = image<crnlib::color_quad<unsigned_char,_int>_>::get_width(this_00);
            in_stack_ffffffffffffeff0 =
                 math::minimum<unsigned_int>(in_stack_ffffffffffffeff4,uVar5 - 1);
            pcVar10 = image<crnlib::color_quad<unsigned_char,_int>_>::operator()
                                (this_00,in_stack_ffffffffffffeff0,uVar8);
            color_quad<unsigned_char,_int>::operator=
                      (local_fa8 + (local_fb8 + local_fb0 * 4),pcVar10);
          }
        }
        set_block_pixels(in_stack_fffffffffffff240,in_stack_fffffffffffff23c,
                         in_stack_fffffffffffff238,in_stack_fffffffffffff230,
                         in_stack_fffffffffffff228,in_stack_fffffffffffff220);
      }
      local_40 = local_40 + 1;
    }
    local_f48 = local_f48 + 1;
  } while( true );
}

Assistant:

void dxt_image::init_task(uint64 data, void* pData_ptr) {
  const uint thread_index = static_cast<uint>(data);
  init_task_params* pInit_params = static_cast<init_task_params*>(pData_ptr);

  const image_u8& img = *pInit_params->m_pImg;
  const pack_params& p = *pInit_params->m_pParams;
  const bool is_main_thread = (crn_get_current_thread_id() == pInit_params->m_main_thread);

  uint block_index = 0;

  set_block_pixels_context optimizer_context;
  int prev_progress_percentage = -1;

  for (uint block_y = 0; block_y < m_blocks_y; block_y++) {
    const uint pixel_ofs_y = block_y * cDXTBlockSize;

    for (uint block_x = 0; block_x < m_blocks_x; block_x++, block_index++) {
      if (pInit_params->m_canceled)
        return;

      if (p.m_pProgress_callback && is_main_thread && ((block_index & 63) == 63)) {
        const uint progress_percentage = p.m_progress_start + ((block_index * p.m_progress_range + get_total_blocks() / 2) / get_total_blocks());
        if ((int)progress_percentage != prev_progress_percentage) {
          prev_progress_percentage = progress_percentage;
          if (!(p.m_pProgress_callback)(progress_percentage, p.m_pProgress_callback_user_data_ptr)) {
            atomic_exchange32(&pInit_params->m_canceled, CRNLIB_TRUE);
            return;
          }
        }
      }

      if (p.m_num_helper_threads) {
        if ((block_index % (p.m_num_helper_threads + 1)) != thread_index)
          continue;
      }

      color_quad_u8 pixels[cDXTBlockSize * cDXTBlockSize];

      const uint pixel_ofs_x = block_x * cDXTBlockSize;

      for (uint y = 0; y < cDXTBlockSize; y++) {
        const uint iy = math::minimum(pixel_ofs_y + y, img.get_height() - 1);

        for (uint x = 0; x < cDXTBlockSize; x++) {
          const uint ix = math::minimum(pixel_ofs_x + x, img.get_width() - 1);

          pixels[x + y * cDXTBlockSize] = img(ix, iy);
        }
      }

      set_block_pixels(block_x, block_y, pixels, p, optimizer_context);
    }
  }
}